

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall
ncnn::Crop::forward(Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  const_reference pvVar1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Crop *in_RDI;
  bool bVar2;
  Mat borderm_1;
  Mat m_5;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  Mat borderm;
  Mat m_1;
  int q;
  Mat bottom_blob_sliced;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  Mat *top_blob;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *reference_blob;
  Mat *bottom_blob;
  Mat *m_4;
  Mat *m;
  Mat *m_6;
  Mat *m_2;
  Mat *m_7;
  Mat *m_3;
  Allocator *_allocator;
  Allocator *_allocator_00;
  int *piVar3;
  int _w;
  undefined4 in_stack_ffffffffffffed70;
  int in_stack_ffffffffffffed74;
  int in_stack_ffffffffffffed78;
  int in_stack_ffffffffffffed7c;
  Mat *in_stack_ffffffffffffed80;
  void **ppvVar4;
  Allocator *in_stack_ffffffffffffedd0;
  undefined8 local_f98;
  undefined8 local_f90;
  undefined8 local_f88;
  undefined4 local_f80;
  Allocator *local_f78;
  undefined4 local_f70;
  undefined4 local_f6c;
  undefined4 local_f68;
  undefined4 local_f64;
  undefined4 local_f60;
  undefined8 local_f58;
  void *local_f50;
  int *local_f48;
  size_t local_f40;
  int local_f38;
  Allocator *local_f30;
  undefined4 local_f28;
  int local_f24;
  int local_f20;
  undefined4 local_f1c;
  undefined4 local_f18;
  long local_f10;
  undefined8 local_f08;
  undefined8 local_f00;
  undefined8 local_ef8;
  undefined4 local_ef0;
  Allocator *local_ee8;
  undefined4 local_ee0;
  undefined4 local_edc;
  undefined4 local_ed8;
  undefined4 local_ed4;
  undefined4 local_ed0;
  undefined8 local_ec8;
  void *local_ec0;
  int *local_eb8;
  ulong local_eb0;
  int local_ea8;
  Allocator *local_ea0;
  undefined4 local_e98;
  int local_e94;
  int local_e90;
  undefined4 local_e8c;
  undefined4 local_e88;
  long local_e80;
  int local_e78;
  int local_e74;
  Mat local_e70;
  void *local_e28;
  int *local_e20;
  ulong local_e18;
  int local_e10;
  Allocator *local_e08;
  int local_e00;
  int local_dfc;
  int local_df8;
  uint local_df4;
  int local_df0;
  ulong local_de8;
  void *local_de0;
  int *local_dd8;
  ulong local_dd0;
  int local_dc8;
  Allocator *local_dc0;
  int local_db8;
  int local_db4;
  int local_db0;
  undefined4 local_dac;
  int local_da8;
  ulong local_da0;
  void *local_d98;
  int *local_d90;
  ulong local_d88;
  int local_d80;
  Allocator *local_d78;
  int local_d70;
  int local_d6c;
  int local_d68;
  undefined4 local_d64;
  uint local_d60;
  ulong local_d58;
  int local_d50;
  undefined4 local_d4c;
  Mat local_d48;
  void *local_d00;
  int *local_cf8;
  ulong local_cf0;
  int local_ce8;
  Allocator *local_ce0;
  int local_cd8;
  int local_cd4;
  int local_cd0;
  uint local_ccc;
  int local_cc8;
  ulong local_cc0;
  Mat local_cb8;
  Mat local_c70;
  Mat local_c18;
  int local_bd0;
  undefined1 local_bcc [8];
  int local_bc4;
  int local_bc0;
  int local_bbc;
  int local_bb8;
  int local_bb4;
  const_reference local_bb0;
  size_t local_ba8;
  int local_b9c;
  int local_b98;
  int local_b94;
  int local_b90;
  int local_b8c;
  const_reference local_b88;
  const_reference local_b80;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_b70;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_b68;
  int local_b54;
  Mat *local_b50;
  Mat *local_b40;
  Mat *local_b30;
  Mat *local_b20;
  void **local_b10;
  void **local_b00;
  void **local_af0;
  Mat *local_ae0;
  undefined8 *local_ad0;
  undefined8 *local_ac0;
  void **local_ab0;
  void **local_aa0;
  void **local_a90;
  int local_a80;
  undefined4 local_a7c;
  const_reference local_a78;
  const_reference local_a70;
  const_reference local_a68;
  int local_a60;
  undefined4 local_a5c;
  const_reference local_a58;
  const_reference local_a50;
  int local_a40;
  undefined4 local_a3c;
  const_reference local_a38;
  const_reference local_a30;
  const_reference local_a28;
  int local_a20;
  undefined4 local_a1c;
  const_reference local_a18;
  const_reference local_a10;
  int local_a00;
  undefined4 local_9fc;
  const_reference local_9f8;
  const_reference local_9f0;
  int local_9e0;
  undefined4 local_9dc;
  const_reference local_9d8;
  const_reference local_9d0;
  const_reference local_9c0;
  const_reference local_9b8;
  const_reference local_9b0;
  const_reference local_9a8;
  const_reference local_9a0;
  const_reference local_998;
  const_reference local_990;
  Mat *local_988;
  Mat *local_980;
  const_reference local_978;
  Mat *local_970;
  Mat *local_968;
  const_reference local_960;
  Mat *local_958;
  Mat *local_950;
  undefined1 local_941;
  int local_93c;
  const_reference local_938;
  void **local_930;
  undefined1 local_919;
  int local_914;
  const_reference local_910;
  void **local_908;
  undefined1 local_8f5;
  int local_8f4;
  void **local_8f0;
  undefined8 *local_8e8;
  undefined1 local_8d5;
  int local_8d4;
  void **local_8d0;
  void **local_8c8;
  undefined1 local_8b5;
  int local_8b4;
  const_reference local_8b0;
  undefined8 *local_8a8;
  undefined1 local_895;
  int local_894;
  const_reference local_890;
  void **local_888;
  int local_874;
  undefined8 *local_870;
  void **local_868;
  int local_85c;
  undefined8 *local_858;
  void **local_850;
  const_reference local_848;
  int local_7e0;
  undefined4 local_7dc;
  const_reference local_7d8;
  int local_7d0;
  undefined4 local_7cc;
  const_reference local_7c8;
  int local_7c0;
  undefined4 local_7bc;
  const_reference local_7b8;
  int local_7b0;
  undefined4 local_7ac;
  const_reference local_7a8;
  int local_7a0;
  undefined4 local_79c;
  const_reference local_798;
  int local_790;
  undefined4 local_78c;
  const_reference local_788;
  int local_770;
  undefined4 local_76c;
  void **local_768;
  int local_750;
  undefined4 local_74c;
  void **local_748;
  int local_730;
  undefined4 local_72c;
  void **local_728;
  undefined8 *local_708;
  undefined8 *local_6e8;
  int local_6d0;
  undefined4 local_6cc;
  Mat *local_6c8;
  int local_6b0;
  undefined4 local_6ac;
  void **local_6a8;
  int local_690;
  undefined4 local_68c;
  void **local_688;
  int local_670;
  undefined4 local_66c;
  void **local_668;
  int local_650;
  undefined4 local_64c;
  Mat *local_648;
  int local_630;
  undefined4 local_62c;
  Mat *local_628;
  int local_610;
  undefined4 local_60c;
  Mat *local_608;
  int local_5f0;
  undefined4 local_5ec;
  Mat *local_5e8;
  void *local_5e0;
  void *local_5d0;
  void *local_5c0;
  void *local_5a0;
  void *local_590;
  void *local_580;
  void *local_540;
  void *local_530;
  void *local_520;
  void *local_510;
  void *local_508;
  void *local_500;
  void *local_4f8;
  void *local_4f0;
  void *local_4e8;
  const_reference local_4b0;
  const_reference local_4a8;
  const_reference local_4a0;
  const_reference local_498;
  const_reference local_490;
  const_reference local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  int local_464;
  Mat *local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  int local_43c;
  Mat *local_438;
  undefined8 local_430;
  undefined8 local_428;
  undefined8 local_420;
  int local_414;
  Mat *local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  int local_3f0;
  int local_3ec;
  Mat *local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  int local_3c8;
  int local_3c4;
  Mat *local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  int local_3a0;
  int local_39c;
  Mat *local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  int local_374;
  int local_370;
  int local_36c;
  Mat *local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  int local_344;
  int local_340;
  int local_33c;
  Mat *local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  int local_314;
  int local_310;
  int local_30c;
  Mat *local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  Mat *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  Mat *local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  Mat *local_278;
  undefined4 local_26c;
  long local_268;
  undefined4 local_25c;
  long local_258;
  undefined4 local_24c;
  long local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  Allocator *local_210;
  int local_204;
  ulong local_200;
  void *local_1f8;
  uint local_1ec;
  int local_1e8;
  int local_1e4;
  void **local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  Allocator *local_1c8;
  int local_1bc;
  ulong local_1b8;
  void *local_1b0;
  uint local_1a4;
  int local_1a0;
  int local_19c;
  void **local_198;
  undefined4 local_18c;
  long local_188;
  Allocator *local_180;
  int local_174;
  ulong local_170;
  void *local_168;
  int local_15c;
  int local_158;
  int local_154;
  void **local_150;
  undefined4 local_144;
  long local_140;
  Allocator *local_138;
  int local_12c;
  size_t local_128;
  void *local_120;
  int local_114;
  int local_110;
  int local_10c;
  undefined8 *local_108;
  undefined4 local_fc;
  long local_f8;
  Allocator *local_f0;
  int local_e4;
  ulong local_e0;
  void *local_d8;
  uint local_cc;
  int local_c8;
  int local_c4;
  void **local_c0;
  undefined4 local_b4;
  long local_b0;
  Allocator *local_a8;
  int local_9c;
  ulong local_98;
  void *local_90;
  uint local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  Allocator *local_60;
  int local_54;
  size_t local_50;
  void *local_48;
  int local_40;
  int local_3c;
  void **local_38;
  Allocator *local_30;
  int local_24;
  ulong local_20;
  void *local_18;
  int local_10;
  int local_c;
  void **local_8;
  
  local_b70 = in_RDX;
  local_b68 = in_RSI;
  local_b80 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_b88 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_b68,1);
  local_b8c = local_b80->w;
  local_b90 = local_b80->h;
  local_b94 = local_b80->d;
  local_b98 = local_b80->c;
  local_b9c = local_b80->dims;
  local_ba8 = local_b80->elemsize;
  local_bb0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_b70,0);
  local_bc0 = -1;
  local_bc4 = -1;
  local_bcc._4_4_ = -1;
  local_bcc._0_4_ = -1;
  if (in_RDI->woffset == -0xe9) {
    local_958 = &local_c18;
    local_960 = local_b80;
    if (local_b80->dims == 1) {
      local_464 = local_b80->w * local_b80->elempack;
      local_460 = &local_c18;
      local_470 = 0;
      local_478 = 4;
      local_480 = 0;
      local_c18.elemsize = 4;
      local_c18.elempack = 1;
      local_c18.dims = 1;
      local_c18.h = 1;
      local_c18.d = 1;
      local_c18.c = 1;
      local_c18.cstep = (size_t)local_464;
      local_c18.w = local_464;
    }
    else if (local_b80->dims == 2) {
      local_3ec = local_b80->w;
      local_3f0 = local_b80->h * local_b80->elempack;
      local_3e8 = &local_c18;
      local_3f8 = 0;
      local_400 = 4;
      local_408 = 0;
      local_c18.elemsize = 4;
      local_c18.elempack = 1;
      local_c18.dims = 2;
      local_c18.d = 1;
      local_c18.c = 1;
      local_c18.cstep = (long)local_3ec * (long)local_3f0;
      local_c18.w = local_3ec;
      local_c18.h = local_3f0;
    }
    else if (local_b80->dims == 3) {
      local_36c = local_b80->w;
      local_370 = local_b80->h;
      local_374 = local_b80->c * local_b80->elempack;
      local_368 = &local_c18;
      local_380 = 0;
      local_388 = 4;
      local_390 = 0;
      local_c18.elemsize = 4;
      local_c18.elempack = 1;
      local_c18.dims = 3;
      local_c18.d = 1;
      local_218 = (long)local_36c * (long)local_370 * 4;
      local_21c = 0x10;
      local_c18.cstep = (local_218 + 0xfU & 0xfffffffffffffff0) / 4;
      local_c18.w = local_36c;
      local_c18.h = local_370;
      local_c18.c = local_374;
    }
    else if (local_b80->dims == 4) {
      local_2dc = local_b80->w;
      local_2e0 = local_b80->h;
      local_2e4 = local_b80->d;
      local_2e8 = local_b80->c * local_b80->elempack;
      local_2d8 = &local_c18;
      local_2f0 = 0;
      local_2f8 = 4;
      local_300 = 0;
      local_c18.elemsize = 4;
      local_c18.elempack = 1;
      local_c18.dims = 4;
      local_248 = (long)local_2dc * (long)local_2e0 * (long)local_2e4 * 4;
      local_24c = 0x10;
      local_c18.cstep = (local_248 + 0xfU & 0xfffffffffffffff0) / 4;
      local_c18.w = local_2dc;
      local_c18.h = local_2e0;
      local_c18.d = local_2e4;
      local_c18.c = local_2e8;
    }
    else {
      local_950 = &local_c18;
      local_c18.elemsize = 0;
      local_c18.elempack = 0;
      local_c18.dims = 0;
      local_c18.w = 0;
      local_c18.h = 0;
      local_c18.d = 0;
      local_c18.c = 0;
      local_c18.cstep = 0;
    }
    local_c18.allocator = (Allocator *)0x0;
    local_c18.refcount = (int *)0x0;
    local_c18.data = (void *)0x0;
    local_848 = local_b88;
    piVar3 = &local_bd0;
    _allocator_00 = (Allocator *)local_bcc;
    _allocator = (Allocator *)(local_bcc + 4);
    resolve_crop_roi(in_RDI,&local_c18,(int *)local_b88->data,&local_bb4,&local_bb8,&local_bbc,
                     &local_bc0,&local_bc4,(int *)_allocator,(int *)_allocator_00,piVar3);
    local_b50 = &local_c18;
    local_5e8 = local_b50;
    if (local_c18.refcount != (int *)0x0) {
      local_5ec = 0xffffffff;
      LOCK();
      local_5f0 = *local_c18.refcount;
      *local_c18.refcount = *local_c18.refcount + -1;
      UNLOCK();
      if (local_5f0 == 1) {
        if (local_c18.allocator == (Allocator *)0x0) {
          local_5e0 = local_c18.data;
          if (local_c18.data != (void *)0x0) {
            free(local_c18.data);
          }
        }
        else {
          (*(local_c18.allocator)->_vptr_Allocator[3])(local_c18.allocator,local_c18.data);
        }
      }
    }
    local_c18.data = (void *)0x0;
    local_c18.elemsize = 0;
    local_c18.elempack = 0;
    local_c18.dims = 0;
    local_c18.w = 0;
    local_c18.h = 0;
    local_c18.d = 0;
    local_c18.c = 0;
    local_c18.cstep = 0;
    local_c18.refcount = (int *)0x0;
  }
  else {
    local_970 = &local_c70;
    local_978 = local_b80;
    if (local_b80->dims == 1) {
      local_43c = local_b80->w * local_b80->elempack;
      local_438 = &local_c70;
      local_448 = 0;
      local_450 = 4;
      local_458 = 0;
      local_c70.elemsize = 4;
      local_c70.elempack = 1;
      local_c70.dims = 1;
      local_c70.h = 1;
      local_c70.d = 1;
      local_c70.c = 1;
      local_c70.cstep = (size_t)local_43c;
      local_c70.w = local_43c;
    }
    else if (local_b80->dims == 2) {
      local_3c4 = local_b80->w;
      local_3c8 = local_b80->h * local_b80->elempack;
      local_3c0 = &local_c70;
      local_3d0 = 0;
      local_3d8 = 4;
      local_3e0 = 0;
      local_c70.elemsize = 4;
      local_c70.elempack = 1;
      local_c70.dims = 2;
      local_c70.d = 1;
      local_c70.c = 1;
      local_c70.cstep = (long)local_3c4 * (long)local_3c8;
      local_c70.w = local_3c4;
      local_c70.h = local_3c8;
    }
    else if (local_b80->dims == 3) {
      local_33c = local_b80->w;
      local_340 = local_b80->h;
      local_344 = local_b80->c * local_b80->elempack;
      local_338 = &local_c70;
      local_350 = 0;
      local_358 = 4;
      local_360 = 0;
      local_c70.elemsize = 4;
      local_c70.elempack = 1;
      local_c70.dims = 3;
      local_c70.d = 1;
      local_228 = (long)local_33c * (long)local_340 * 4;
      local_22c = 0x10;
      local_c70.cstep = (local_228 + 0xfU & 0xfffffffffffffff0) / 4;
      local_c70.w = local_33c;
      local_c70.h = local_340;
      local_c70.c = local_344;
    }
    else if (local_b80->dims == 4) {
      local_2ac = local_b80->w;
      local_2b0 = local_b80->h;
      local_2b4 = local_b80->d;
      local_2b8 = local_b80->c * local_b80->elempack;
      local_2a8 = &local_c70;
      local_2c0 = 0;
      local_2c8 = 4;
      local_2d0 = 0;
      local_c70.elemsize = 4;
      local_c70.elempack = 1;
      local_c70.dims = 4;
      local_258 = (long)local_2ac * (long)local_2b0 * (long)local_2b4 * 4;
      local_25c = 0x10;
      local_c70.cstep = (local_258 + 0xfU & 0xfffffffffffffff0) / 4;
      local_c70.w = local_2ac;
      local_c70.h = local_2b0;
      local_c70.d = local_2b4;
      local_c70.c = local_2b8;
    }
    else {
      local_968 = &local_c70;
      local_c70.elemsize = 0;
      local_c70.elempack = 0;
      local_c70.dims = 0;
      local_c70.w = 0;
      local_c70.h = 0;
      local_c70.d = 0;
      local_c70.c = 0;
      local_c70.cstep = 0;
    }
    local_c70.allocator = (Allocator *)0x0;
    local_c70.refcount = (int *)0x0;
    local_c70.data = (void *)0x0;
    local_988 = &local_cb8;
    local_990 = local_b88;
    if (local_b88->dims == 1) {
      local_414 = local_b88->w * local_b88->elempack;
      local_410 = &local_cb8;
      local_420 = 0;
      local_428 = 4;
      local_430 = 0;
      local_cb8.elemsize = 4;
      local_cb8.elempack = 1;
      local_cb8.dims = 1;
      local_cb8.h = 1;
      local_cb8.d = 1;
      local_cb8.c = 1;
      local_cb8.cstep = (size_t)local_414;
      local_cb8.w = local_414;
    }
    else if (local_b88->dims == 2) {
      local_39c = local_b88->w;
      local_3a0 = local_b88->h * local_b88->elempack;
      local_398 = &local_cb8;
      local_3a8 = 0;
      local_3b0 = 4;
      local_3b8 = 0;
      local_cb8.elemsize = 4;
      local_cb8.elempack = 1;
      local_cb8.dims = 2;
      local_cb8.d = 1;
      local_cb8.c = 1;
      local_cb8.cstep = (long)local_39c * (long)local_3a0;
      local_cb8.w = local_39c;
      local_cb8.h = local_3a0;
    }
    else if (local_b88->dims == 3) {
      local_30c = local_b88->w;
      local_310 = local_b88->h;
      local_314 = local_b88->c * local_b88->elempack;
      local_308 = &local_cb8;
      local_320 = 0;
      local_328 = 4;
      local_330 = 0;
      local_cb8.elemsize = 4;
      local_cb8.elempack = 1;
      local_cb8.dims = 3;
      local_cb8.d = 1;
      local_238 = (long)local_30c * (long)local_310 * 4;
      local_23c = 0x10;
      local_cb8.cstep = (local_238 + 0xfU & 0xfffffffffffffff0) / 4;
      local_cb8.w = local_30c;
      local_cb8.h = local_310;
      local_cb8.c = local_314;
    }
    else if (local_b88->dims == 4) {
      local_27c = local_b88->w;
      local_280 = local_b88->h;
      local_284 = local_b88->d;
      local_288 = local_b88->c * local_b88->elempack;
      local_278 = &local_cb8;
      local_290 = 0;
      local_298 = 4;
      local_2a0 = 0;
      local_cb8.elemsize = 4;
      local_cb8.elempack = 1;
      local_cb8.dims = 4;
      local_268 = (long)local_27c * (long)local_280 * (long)local_284 * 4;
      local_26c = 0x10;
      local_cb8.cstep = (local_268 + 0xfU & 0xfffffffffffffff0) / 4;
      local_cb8.w = local_27c;
      local_cb8.h = local_280;
      local_cb8.d = local_284;
      local_cb8.c = local_288;
    }
    else {
      local_980 = &local_cb8;
      local_cb8.elemsize = 0;
      local_cb8.elempack = 0;
      local_cb8.dims = 0;
      local_cb8.w = 0;
      local_cb8.h = 0;
      local_cb8.d = 0;
      local_cb8.c = 0;
      local_cb8.cstep = 0;
    }
    local_cb8.allocator = (Allocator *)0x0;
    local_cb8.refcount = (int *)0x0;
    local_cb8.data = (void *)0x0;
    piVar3 = &local_bd0;
    _allocator_00 = (Allocator *)local_bcc;
    _allocator = (Allocator *)(local_bcc + 4);
    resolve_crop_roi(in_RDI,&local_c70,&local_cb8,&local_bb4,&local_bb8,&local_bbc,&local_bc0,
                     &local_bc4,(int *)_allocator,(int *)_allocator_00,piVar3);
    local_b40 = &local_cb8;
    local_608 = local_b40;
    if (local_cb8.refcount != (int *)0x0) {
      local_60c = 0xffffffff;
      LOCK();
      local_610 = *local_cb8.refcount;
      *local_cb8.refcount = *local_cb8.refcount + -1;
      UNLOCK();
      if (local_610 == 1) {
        if (local_cb8.allocator == (Allocator *)0x0) {
          local_5d0 = local_cb8.data;
          if (local_cb8.data != (void *)0x0) {
            free(local_cb8.data);
          }
        }
        else {
          (*(local_cb8.allocator)->_vptr_Allocator[3])(local_cb8.allocator,local_cb8.data);
        }
      }
    }
    local_cb8.data = (void *)0x0;
    local_cb8.elemsize = 0;
    local_cb8.elempack = 0;
    local_cb8.dims = 0;
    local_cb8.w = 0;
    local_cb8.h = 0;
    local_cb8.d = 0;
    local_cb8.c = 0;
    local_cb8.cstep = 0;
    local_cb8.refcount = (int *)0x0;
    local_b30 = &local_c70;
    local_628 = local_b30;
    if (local_c70.refcount != (int *)0x0) {
      local_62c = 0xffffffff;
      LOCK();
      local_630 = *local_c70.refcount;
      *local_c70.refcount = *local_c70.refcount + -1;
      UNLOCK();
      if (local_630 == 1) {
        if (local_c70.allocator == (Allocator *)0x0) {
          local_5c0 = local_c70.data;
          if (local_c70.data != (void *)0x0) {
            free(local_c70.data);
          }
        }
        else {
          (*(local_c70.allocator)->_vptr_Allocator[3])(local_c70.allocator,local_c70.data);
        }
      }
    }
    local_c70.data = (void *)0x0;
    local_c70.elemsize = 0;
    local_c70.elempack = 0;
    local_c70.dims = 0;
    local_c70.w = 0;
    local_c70.h = 0;
    local_c70.d = 0;
    local_c70.c = 0;
    local_c70.cstep = 0;
    local_c70.refcount = (int *)0x0;
  }
  pvVar1 = local_bb0;
  _w = (int)((ulong)piVar3 >> 0x20);
  if (local_b9c == 1) {
    if (local_bc4 == local_b8c) {
      local_9d0 = local_bb0;
      local_9d8 = local_b80;
      if (local_bb0 != local_b80) {
        if (local_b80->refcount != (int *)0x0) {
          piVar3 = local_b80->refcount;
          local_9dc = 1;
          LOCK();
          local_9e0 = *piVar3;
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        local_7d8 = local_bb0;
        if (local_bb0->refcount != (int *)0x0) {
          piVar3 = local_bb0->refcount;
          local_7dc = 0xffffffff;
          LOCK();
          local_7e0 = *piVar3;
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (local_7e0 == 1) {
            if (local_bb0->allocator == (Allocator *)0x0) {
              local_4e8 = local_bb0->data;
              if (local_4e8 != (void *)0x0) {
                free(local_4e8);
              }
            }
            else {
              (*local_bb0->allocator->_vptr_Allocator[3])(local_bb0->allocator,local_bb0->data);
            }
          }
        }
        pvVar1->data = (void *)0x0;
        pvVar1->elemsize = 0;
        pvVar1->elempack = 0;
        pvVar1->dims = 0;
        pvVar1->w = 0;
        pvVar1->h = 0;
        pvVar1->d = 0;
        pvVar1->c = 0;
        pvVar1->cstep = 0;
        pvVar1->refcount = (int *)0x0;
        pvVar1->data = local_9d8->data;
        pvVar1->refcount = local_9d8->refcount;
        pvVar1->elemsize = local_9d8->elemsize;
        pvVar1->elempack = local_9d8->elempack;
        pvVar1->allocator = local_9d8->allocator;
        pvVar1->dims = local_9d8->dims;
        pvVar1->w = local_9d8->w;
        pvVar1->h = local_9d8->h;
        pvVar1->d = local_9d8->d;
        pvVar1->c = local_9d8->c;
        pvVar1->cstep = local_9d8->cstep;
      }
      local_b54 = 0;
    }
    else {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),_w,
                  (size_t)_allocator_00,_allocator);
      local_998 = local_bb0;
      bVar2 = true;
      if (local_bb0->data != (void *)0x0) {
        local_4b0 = local_bb0;
        bVar2 = local_bb0->cstep * (long)local_bb0->c == 0;
      }
      if (bVar2) {
        local_b54 = -100;
      }
      else {
        if (local_ba8 == 1) {
          copy_cut_border_image<signed_char>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                     (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     (int)((ulong)piVar3 >> 0x20),(int)piVar3);
        }
        if (local_ba8 == 2) {
          copy_cut_border_image<unsigned_short>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                     (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     (int)((ulong)piVar3 >> 0x20),(int)piVar3);
        }
        if (local_ba8 == 4) {
          copy_cut_border_image<float>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                     (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     (int)((ulong)piVar3 >> 0x20),(int)piVar3);
        }
        local_b54 = 0;
      }
    }
  }
  else if (local_b9c == 2) {
    if ((local_bc4 == local_b8c) && (local_bcc._4_4_ == local_b90)) {
      local_9f0 = local_bb0;
      local_9f8 = local_b80;
      if (local_bb0 != local_b80) {
        if (local_b80->refcount != (int *)0x0) {
          piVar3 = local_b80->refcount;
          local_9fc = 1;
          LOCK();
          local_a00 = *piVar3;
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        local_7c8 = local_bb0;
        if (local_bb0->refcount != (int *)0x0) {
          piVar3 = local_bb0->refcount;
          local_7cc = 0xffffffff;
          LOCK();
          local_7d0 = *piVar3;
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (local_7d0 == 1) {
            if (local_bb0->allocator == (Allocator *)0x0) {
              local_4f0 = local_bb0->data;
              if (local_4f0 != (void *)0x0) {
                free(local_4f0);
              }
            }
            else {
              (*local_bb0->allocator->_vptr_Allocator[3])(local_bb0->allocator,local_bb0->data);
            }
          }
        }
        pvVar1->data = (void *)0x0;
        pvVar1->elemsize = 0;
        pvVar1->elempack = 0;
        pvVar1->dims = 0;
        pvVar1->w = 0;
        pvVar1->h = 0;
        pvVar1->d = 0;
        pvVar1->c = 0;
        pvVar1->cstep = 0;
        pvVar1->refcount = (int *)0x0;
        pvVar1->data = local_9f8->data;
        pvVar1->refcount = local_9f8->refcount;
        pvVar1->elemsize = local_9f8->elemsize;
        pvVar1->elempack = local_9f8->elempack;
        pvVar1->allocator = local_9f8->allocator;
        pvVar1->dims = local_9f8->dims;
        pvVar1->w = local_9f8->w;
        pvVar1->h = local_9f8->h;
        pvVar1->d = local_9f8->d;
        pvVar1->c = local_9f8->c;
        pvVar1->cstep = local_9f8->cstep;
      }
      local_b54 = 0;
    }
    else {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),_w,
                  (int)piVar3,(size_t)_allocator_00,_allocator);
      local_9a0 = local_bb0;
      bVar2 = true;
      if (local_bb0->data != (void *)0x0) {
        local_4a8 = local_bb0;
        bVar2 = local_bb0->cstep * (long)local_bb0->c == 0;
      }
      if (bVar2) {
        local_b54 = -100;
      }
      else {
        if (local_ba8 == 1) {
          copy_cut_border_image<signed_char>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                     (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     (int)((ulong)piVar3 >> 0x20),(int)piVar3);
        }
        if (local_ba8 == 2) {
          copy_cut_border_image<unsigned_short>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                     (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     (int)((ulong)piVar3 >> 0x20),(int)piVar3);
        }
        if (local_ba8 == 4) {
          copy_cut_border_image<float>
                    ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                     (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     (int)((ulong)piVar3 >> 0x20),(int)piVar3);
        }
        local_b54 = 0;
      }
    }
  }
  else if (local_b9c == 3) {
    if (((local_bc4 == local_b8c) && (local_bcc._4_4_ == local_b90)) && (local_bd0 == local_b98)) {
      local_a10 = local_bb0;
      local_a18 = local_b80;
      if (local_bb0 != local_b80) {
        if (local_b80->refcount != (int *)0x0) {
          piVar3 = local_b80->refcount;
          local_a1c = 1;
          LOCK();
          local_a20 = *piVar3;
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        local_7b8 = local_bb0;
        if (local_bb0->refcount != (int *)0x0) {
          piVar3 = local_bb0->refcount;
          local_7bc = 0xffffffff;
          LOCK();
          local_7c0 = *piVar3;
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (local_7c0 == 1) {
            if (local_bb0->allocator == (Allocator *)0x0) {
              local_4f8 = local_bb0->data;
              if (local_4f8 != (void *)0x0) {
                free(local_4f8);
              }
            }
            else {
              (*local_bb0->allocator->_vptr_Allocator[3])(local_bb0->allocator,local_bb0->data);
            }
          }
        }
        pvVar1->data = (void *)0x0;
        pvVar1->elemsize = 0;
        pvVar1->elempack = 0;
        pvVar1->dims = 0;
        pvVar1->w = 0;
        pvVar1->h = 0;
        pvVar1->d = 0;
        pvVar1->c = 0;
        pvVar1->cstep = 0;
        pvVar1->refcount = (int *)0x0;
        pvVar1->data = local_a18->data;
        pvVar1->refcount = local_a18->refcount;
        pvVar1->elemsize = local_a18->elemsize;
        pvVar1->elempack = local_a18->elempack;
        pvVar1->allocator = local_a18->allocator;
        pvVar1->dims = local_a18->dims;
        pvVar1->w = local_a18->w;
        pvVar1->h = local_a18->h;
        pvVar1->d = local_a18->d;
        pvVar1->c = local_a18->c;
        pvVar1->cstep = local_a18->cstep;
      }
      local_b54 = 0;
    }
    else {
      local_908 = &local_d00;
      local_1e4 = local_b80->w;
      local_1e8 = local_b80->h;
      local_1ec = local_b80->d;
      local_1f8 = (void *)((long)local_b80->data +
                          local_b80->cstep * (long)local_bc0 * local_b80->elemsize);
      local_200 = local_b80->elemsize;
      local_204 = local_b80->elempack;
      local_210 = local_b80->allocator;
      local_1e0 = &local_d00;
      local_cf8 = (int *)0x0;
      local_cc8 = local_bd0;
      local_1d0 = (long)local_1e4 * (long)local_1e8 * (long)(int)local_1ec * local_200;
      local_cc0 = (local_1d0 + 0xfU & 0xfffffffffffffff0) / local_200;
      local_cd8 = local_b80->dims;
      local_1d4 = 0x10;
      local_910 = local_b80;
      local_914 = local_bc0;
      local_919 = 1;
      local_d00 = local_1f8;
      local_cf0 = local_200;
      local_ce8 = local_204;
      local_ce0 = local_210;
      local_cd4 = local_1e4;
      local_cd0 = local_1e8;
      local_ccc = local_1ec;
      if ((local_bc4 == local_b8c) && (local_bcc._4_4_ == local_b90)) {
        Mat::clone(&local_d48,(__fn *)&local_d00,(void *)0x0,(int)local_1e0,(void *)(ulong)local_1ec
                  );
        pvVar1 = local_bb0;
        local_a30 = local_bb0;
        local_a38 = &local_d48;
        if (local_bb0 != local_a38) {
          if (local_d48.refcount != (int *)0x0) {
            local_a3c = 1;
            LOCK();
            local_a40 = *local_d48.refcount;
            *local_d48.refcount = *local_d48.refcount + 1;
            UNLOCK();
          }
          local_7a8 = local_bb0;
          if (local_bb0->refcount != (int *)0x0) {
            piVar3 = local_bb0->refcount;
            local_7ac = 0xffffffff;
            LOCK();
            local_7b0 = *piVar3;
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (local_7b0 == 1) {
              if (local_bb0->allocator == (Allocator *)0x0) {
                local_500 = local_bb0->data;
                if (local_500 != (void *)0x0) {
                  free(local_500);
                }
              }
              else {
                (*local_bb0->allocator->_vptr_Allocator[3])(local_bb0->allocator,local_bb0->data);
              }
            }
          }
          pvVar1->data = (void *)0x0;
          pvVar1->elemsize = 0;
          pvVar1->elempack = 0;
          pvVar1->dims = 0;
          pvVar1->w = 0;
          pvVar1->h = 0;
          pvVar1->d = 0;
          pvVar1->c = 0;
          pvVar1->cstep = 0;
          pvVar1->refcount = (int *)0x0;
          pvVar1->data = local_a38->data;
          pvVar1->refcount = local_a38->refcount;
          pvVar1->elemsize = local_a38->elemsize;
          pvVar1->elempack = local_a38->elempack;
          pvVar1->allocator = local_a38->allocator;
          pvVar1->dims = local_a38->dims;
          pvVar1->w = local_a38->w;
          pvVar1->h = local_a38->h;
          pvVar1->d = local_a38->d;
          pvVar1->c = local_a38->c;
          pvVar1->cstep = local_a38->cstep;
        }
        local_a28 = pvVar1;
        local_b20 = &local_d48;
        local_648 = local_b20;
        if (local_d48.refcount != (int *)0x0) {
          local_64c = 0xffffffff;
          LOCK();
          local_650 = *local_d48.refcount;
          *local_d48.refcount = *local_d48.refcount + -1;
          UNLOCK();
          if (local_650 == 1) {
            if (local_d48.allocator == (Allocator *)0x0) {
              if (local_d48.data != (void *)0x0) {
                free(local_d48.data);
              }
            }
            else {
              (*(local_d48.allocator)->_vptr_Allocator[3])(local_d48.allocator,local_d48.data);
            }
          }
        }
        local_d48.data = (void *)0x0;
        local_d48.elemsize = 0;
        local_d48.elempack = 0;
        local_d48.dims = 0;
        local_d48.w = 0;
        local_d48.h = 0;
        local_d48.d = 0;
        local_d48.c = 0;
        local_d48.cstep = 0;
        local_d48.refcount = (int *)0x0;
        local_9a8 = local_bb0;
        bVar2 = true;
        if (local_bb0->data != (void *)0x0) {
          local_4a0 = local_bb0;
          bVar2 = local_bb0->cstep * (long)local_bb0->c == 0;
        }
        if (bVar2) {
          local_b54 = -100;
        }
        else {
          local_b54 = 0;
        }
      }
      else {
        Mat::create(in_stack_ffffffffffffed80,in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78,
                    in_stack_ffffffffffffed74,(size_t)piVar3,_allocator_00);
        local_9b0 = local_bb0;
        bVar2 = true;
        if (local_bb0->data != (void *)0x0) {
          local_498 = local_bb0;
          bVar2 = local_bb0->cstep * (long)local_bb0->c == 0;
        }
        if (bVar2) {
          local_b54 = -100;
        }
        else {
          for (local_d50 = 0; local_d50 < local_bd0; local_d50 = local_d50 + 1) {
            local_8c8 = &local_d98;
            local_8d0 = &local_d00;
            local_d8 = (void *)((long)local_d00 + local_cc0 * (long)local_d50 * local_cf0);
            local_c0 = &local_d98;
            local_d90 = (int *)0x0;
            local_d88 = local_cf0;
            local_d80 = local_ce8;
            local_d78 = local_ce0;
            local_d6c = local_cd4;
            local_d68 = local_cd0;
            local_d64 = 1;
            local_d60 = local_ccc;
            local_b0 = (long)local_cd4 * (long)local_cd0 * local_cf0;
            local_d58 = (local_b0 + 0xfU & 0xfffffffffffffff0) / local_cf0;
            local_d70 = local_cd8 + -1;
            if (local_cd8 == 4) {
              local_d58 = (long)local_cd4 * (long)local_cd0;
            }
            local_888 = &local_de0;
            local_154 = local_bb0->w;
            local_158 = local_bb0->h;
            local_15c = local_bb0->d;
            local_168 = (void *)((long)local_bb0->data +
                                local_bb0->cstep * (long)local_d50 * local_bb0->elemsize);
            local_170 = local_bb0->elemsize;
            local_174 = local_bb0->elempack;
            local_180 = local_bb0->allocator;
            local_150 = &local_de0;
            local_dd8 = (int *)0x0;
            local_dac = 1;
            local_140 = (long)local_154 * (long)local_158 * local_170;
            local_da0 = (local_140 + 0xfU & 0xfffffffffffffff0) / local_170;
            local_db8 = local_bb0->dims + -1;
            if (local_bb0->dims == 4) {
              local_da0 = (long)local_bb0->w * (long)local_bb0->h;
            }
            local_b4 = 0x10;
            local_c4 = local_cd4;
            local_c8 = local_cd0;
            local_cc = local_ccc;
            local_e0 = local_cf0;
            local_e4 = local_ce8;
            local_f0 = local_ce0;
            local_144 = 0x10;
            local_890 = local_bb0;
            local_894 = local_d50;
            local_895 = 1;
            local_8d4 = local_d50;
            local_8d5 = 1;
            local_de0 = local_168;
            local_dd0 = local_170;
            local_dc8 = local_174;
            local_dc0 = local_180;
            local_db4 = local_154;
            local_db0 = local_158;
            local_da8 = local_15c;
            local_d98 = local_d8;
            if (local_ba8 == 1) {
              copy_cut_border_image<signed_char>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                         (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                         (int)((ulong)piVar3 >> 0x20),(int)piVar3);
            }
            if (local_ba8 == 2) {
              copy_cut_border_image<unsigned_short>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                         (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                         (int)((ulong)piVar3 >> 0x20),(int)piVar3);
            }
            if (local_ba8 == 4) {
              copy_cut_border_image<float>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                         (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                         (int)((ulong)piVar3 >> 0x20),(int)piVar3);
            }
            local_b10 = &local_de0;
            local_668 = local_b10;
            if (local_dd8 != (int *)0x0) {
              local_66c = 0xffffffff;
              LOCK();
              local_670 = *local_dd8;
              *local_dd8 = *local_dd8 + -1;
              UNLOCK();
              if (local_670 == 1) {
                if (local_dc0 == (Allocator *)0x0) {
                  local_5a0 = local_de0;
                  if (local_de0 != (void *)0x0) {
                    free(local_de0);
                  }
                }
                else {
                  (*local_dc0->_vptr_Allocator[3])(local_dc0,local_de0);
                }
              }
            }
            local_de0 = (void *)0x0;
            local_dd0 = 0;
            local_dc8 = 0;
            local_db8 = 0;
            local_db4 = 0;
            local_db0 = 0;
            local_dac = 0;
            local_da8 = 0;
            local_da0 = 0;
            local_dd8 = (int *)0x0;
            local_b00 = &local_d98;
            local_688 = local_b00;
            if (local_d90 != (int *)0x0) {
              local_68c = 0xffffffff;
              LOCK();
              local_690 = *local_d90;
              *local_d90 = *local_d90 + -1;
              UNLOCK();
              if (local_690 == 1) {
                if (local_d78 == (Allocator *)0x0) {
                  local_590 = local_d98;
                  if (local_d98 != (void *)0x0) {
                    free(local_d98);
                  }
                }
                else {
                  (*local_d78->_vptr_Allocator[3])(local_d78,local_d98);
                }
              }
            }
            local_d98 = (void *)0x0;
            local_d88 = 0;
            local_d80 = 0;
            local_d70 = 0;
            local_d6c = 0;
            local_d68 = 0;
            local_d64 = 0;
            local_d60 = 0;
            local_d58 = 0;
            local_d90 = (int *)0x0;
          }
          local_b54 = 0;
        }
      }
      local_d4c = 1;
      local_af0 = &local_d00;
      if (local_cf8 != (int *)0x0) {
        local_6ac = 0xffffffff;
        LOCK();
        local_6b0 = *local_cf8;
        *local_cf8 = *local_cf8 + -1;
        UNLOCK();
        if (local_6b0 == 1) {
          local_6a8 = local_af0;
          if (local_ce0 == (Allocator *)0x0) {
            local_580 = local_d00;
            if (local_d00 != (void *)0x0) {
              free(local_d00);
            }
          }
          else {
            (*local_ce0->_vptr_Allocator[3])(local_ce0,local_d00);
          }
        }
      }
    }
  }
  else if (local_b9c == 4) {
    if ((((local_bc4 == local_b8c) && (local_bcc._4_4_ == local_b90)) &&
        (local_bcc._0_4_ == local_b94)) && (local_bd0 == local_b98)) {
      local_a50 = local_bb0;
      local_a58 = local_b80;
      if (local_bb0 != local_b80) {
        if (local_b80->refcount != (int *)0x0) {
          piVar3 = local_b80->refcount;
          local_a5c = 1;
          LOCK();
          local_a60 = *piVar3;
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        local_798 = local_bb0;
        if (local_bb0->refcount != (int *)0x0) {
          piVar3 = local_bb0->refcount;
          local_79c = 0xffffffff;
          LOCK();
          local_7a0 = *piVar3;
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (local_7a0 == 1) {
            if (local_bb0->allocator == (Allocator *)0x0) {
              local_508 = local_bb0->data;
              if (local_508 != (void *)0x0) {
                free(local_508);
              }
            }
            else {
              (*local_bb0->allocator->_vptr_Allocator[3])(local_bb0->allocator,local_bb0->data);
            }
          }
        }
        pvVar1->data = (void *)0x0;
        pvVar1->elemsize = 0;
        pvVar1->elempack = 0;
        pvVar1->dims = 0;
        pvVar1->w = 0;
        pvVar1->h = 0;
        pvVar1->d = 0;
        pvVar1->c = 0;
        pvVar1->cstep = 0;
        pvVar1->refcount = (int *)0x0;
        pvVar1->data = local_a58->data;
        pvVar1->refcount = local_a58->refcount;
        pvVar1->elemsize = local_a58->elemsize;
        pvVar1->elempack = local_a58->elempack;
        pvVar1->allocator = local_a58->allocator;
        pvVar1->dims = local_a58->dims;
        pvVar1->w = local_a58->w;
        pvVar1->h = local_a58->h;
        pvVar1->d = local_a58->d;
        pvVar1->c = local_a58->c;
        pvVar1->cstep = local_a58->cstep;
      }
      local_b54 = 0;
    }
    else {
      local_930 = &local_e28;
      local_19c = local_b80->w;
      local_1a0 = local_b80->h;
      local_1a4 = local_b80->d;
      local_1b0 = (void *)((long)local_b80->data +
                          local_b80->cstep * (long)local_bc0 * local_b80->elemsize);
      local_1b8 = local_b80->elemsize;
      local_1bc = local_b80->elempack;
      local_1c8 = local_b80->allocator;
      local_198 = &local_e28;
      local_e20 = (int *)0x0;
      local_df0 = local_bd0;
      local_188 = (long)local_19c * (long)local_1a0 * (long)(int)local_1a4 * local_1b8;
      local_de8 = (local_188 + 0xfU & 0xfffffffffffffff0) / local_1b8;
      local_e00 = local_b80->dims;
      local_18c = 0x10;
      local_938 = local_b80;
      local_93c = local_bc0;
      local_941 = 1;
      local_e28 = local_1b0;
      local_e18 = local_1b8;
      local_e10 = local_1bc;
      local_e08 = local_1c8;
      local_dfc = local_19c;
      local_df8 = local_1a0;
      local_df4 = local_1a4;
      if (((local_bc4 == local_b8c) && (local_bcc._4_4_ == local_b90)) &&
         (local_bcc._0_4_ == local_b94)) {
        Mat::clone(&local_e70,(__fn *)&local_e28,(void *)0x0,(int)local_198,(void *)(ulong)local_1a4
                  );
        pvVar1 = local_bb0;
        local_a70 = local_bb0;
        local_a78 = &local_e70;
        if (local_bb0 != local_a78) {
          if (local_e70.refcount != (int *)0x0) {
            local_a7c = 1;
            LOCK();
            local_a80 = *local_e70.refcount;
            *local_e70.refcount = *local_e70.refcount + 1;
            UNLOCK();
          }
          local_788 = local_bb0;
          if (local_bb0->refcount != (int *)0x0) {
            piVar3 = local_bb0->refcount;
            local_78c = 0xffffffff;
            LOCK();
            local_790 = *piVar3;
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (local_790 == 1) {
              if (local_bb0->allocator == (Allocator *)0x0) {
                local_510 = local_bb0->data;
                if (local_510 != (void *)0x0) {
                  free(local_510);
                }
              }
              else {
                (*local_bb0->allocator->_vptr_Allocator[3])(local_bb0->allocator,local_bb0->data);
              }
            }
          }
          pvVar1->data = (void *)0x0;
          pvVar1->elemsize = 0;
          pvVar1->elempack = 0;
          pvVar1->dims = 0;
          pvVar1->w = 0;
          pvVar1->h = 0;
          pvVar1->d = 0;
          pvVar1->c = 0;
          pvVar1->cstep = 0;
          pvVar1->refcount = (int *)0x0;
          pvVar1->data = local_a78->data;
          pvVar1->refcount = local_a78->refcount;
          pvVar1->elemsize = local_a78->elemsize;
          pvVar1->elempack = local_a78->elempack;
          pvVar1->allocator = local_a78->allocator;
          pvVar1->dims = local_a78->dims;
          pvVar1->w = local_a78->w;
          pvVar1->h = local_a78->h;
          pvVar1->d = local_a78->d;
          pvVar1->c = local_a78->c;
          pvVar1->cstep = local_a78->cstep;
        }
        local_a68 = pvVar1;
        local_ae0 = &local_e70;
        local_6c8 = local_ae0;
        if (local_e70.refcount != (int *)0x0) {
          local_6cc = 0xffffffff;
          LOCK();
          local_6d0 = *local_e70.refcount;
          *local_e70.refcount = *local_e70.refcount + -1;
          UNLOCK();
          if (local_6d0 == 1) {
            if (local_e70.allocator == (Allocator *)0x0) {
              if (local_e70.data != (void *)0x0) {
                free(local_e70.data);
              }
            }
            else {
              (*(local_e70.allocator)->_vptr_Allocator[3])(local_e70.allocator,local_e70.data);
            }
          }
        }
        local_e70.data = (void *)0x0;
        local_e70.elemsize = 0;
        local_e70.elempack = 0;
        local_e70.dims = 0;
        local_e70.w = 0;
        local_e70.h = 0;
        local_e70.d = 0;
        local_e70.c = 0;
        local_e70.cstep = 0;
        local_e70.refcount = (int *)0x0;
        local_9b8 = local_bb0;
        bVar2 = true;
        if (local_bb0->data != (void *)0x0) {
          local_490 = local_bb0;
          bVar2 = local_bb0->cstep * (long)local_bb0->c == 0;
        }
        if (bVar2) {
          local_b54 = -100;
        }
        else {
          local_b54 = 0;
        }
      }
      else {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),_w,
                    (int)piVar3,(int)((ulong)_allocator_00 >> 0x20),(int)_allocator_00,
                    (size_t)_allocator,in_stack_ffffffffffffedd0);
        local_9c0 = local_bb0;
        bVar2 = true;
        if (local_bb0->data != (void *)0x0) {
          local_488 = local_bb0;
          bVar2 = local_bb0->cstep * (long)local_bb0->c == 0;
        }
        if (bVar2) {
          local_b54 = -100;
        }
        else {
          for (local_e74 = 0; local_e74 < local_bd0; local_e74 = local_e74 + 1) {
            for (local_e78 = 0; local_e78 < (int)local_bcc._0_4_; local_e78 = local_e78 + 1) {
              local_8e8 = &local_f08;
              local_8f0 = &local_e28;
              local_90 = (void *)((long)local_e28 + local_de8 * (long)local_e74 * local_e18);
              local_78 = &local_f08;
              local_68 = (long)local_dfc * (long)local_df8 * local_e18;
              local_874 = local_e78 + local_bbc;
              local_868 = &local_ec0;
              local_870 = &local_f08;
              local_18 = (void *)((long)local_90 +
                                 (long)local_dfc * (long)local_df8 * (long)local_874 * local_e18);
              local_8 = &local_ec0;
              local_e80 = (long)local_dfc * (long)local_df8;
              local_ad0 = &local_f08;
              local_8a8 = &local_f98;
              local_10c = local_bb0->w;
              local_110 = local_bb0->h;
              local_114 = local_bb0->d;
              local_120 = (void *)((long)local_bb0->data +
                                  local_bb0->cstep * (long)local_e74 * local_bb0->elemsize);
              local_128 = local_bb0->elemsize;
              local_12c = local_bb0->elempack;
              local_138 = local_bb0->allocator;
              local_108 = &local_f98;
              local_f8 = (long)local_10c * (long)local_110 * local_128;
              local_850 = &local_f50;
              local_858 = &local_f98;
              local_48 = (void *)((long)local_120 +
                                 (long)local_10c * (long)local_110 * (long)local_e78 * local_128);
              local_38 = &local_f50;
              local_f10 = (long)local_10c * (long)local_110;
              local_ac0 = &local_f98;
              local_e88 = 1;
              local_e8c = 1;
              local_e90 = local_df8;
              local_e94 = local_dfc;
              local_e98 = 2;
              local_ea0 = local_e08;
              local_ea8 = local_e10;
              local_eb0 = local_e18;
              local_eb8 = (int *)0x0;
              local_ed0 = 0;
              local_ed4 = 0;
              local_ed8 = 0;
              local_edc = 0;
              local_ee8 = local_e08;
              local_ef0 = 0;
              local_ef8 = 0;
              local_f00 = 0;
              local_f08 = 0;
              local_f18 = 1;
              local_f1c = 1;
              local_f28 = 2;
              local_f48 = (int *)0x0;
              local_c = local_dfc;
              local_10 = local_df8;
              local_20 = local_e18;
              local_24 = local_e10;
              local_30 = local_e08;
              local_6c = 0x10;
              local_7c = local_dfc;
              local_80 = local_df8;
              local_84 = local_df4;
              local_98 = local_e18;
              local_9c = local_e10;
              local_a8 = local_e08;
              local_fc = 0x10;
              local_85c = local_e78;
              local_8b0 = local_bb0;
              local_8b4 = local_e74;
              local_8b5 = 1;
              local_8f4 = local_e74;
              local_8f5 = 1;
              local_ec8 = 0;
              local_ee0 = 0;
              local_f98 = 0;
              local_f88 = 0;
              local_f80 = 0;
              local_f70 = 0;
              local_f6c = 0;
              local_f68 = 0;
              local_f64 = 0;
              local_f60 = 0;
              local_f58 = 0;
              local_f90 = 0;
              local_708 = local_ac0;
              local_6e8 = local_ad0;
              local_60 = local_138;
              local_54 = local_12c;
              local_50 = local_128;
              local_40 = local_110;
              local_3c = local_10c;
              local_f78 = local_138;
              local_f50 = local_48;
              local_f40 = local_128;
              local_f38 = local_12c;
              local_f30 = local_138;
              local_f24 = local_10c;
              local_f20 = local_110;
              local_ec0 = local_18;
              if (local_ba8 == 1) {
                copy_cut_border_image<signed_char>
                          ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                           (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                           (int)((ulong)piVar3 >> 0x20),(int)piVar3);
              }
              if (local_ba8 == 2) {
                copy_cut_border_image<unsigned_short>
                          ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                           (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                           (int)((ulong)piVar3 >> 0x20),(int)piVar3);
              }
              if (local_ba8 == 4) {
                copy_cut_border_image<float>
                          ((Mat *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                           (Mat *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                           (int)((ulong)piVar3 >> 0x20),(int)piVar3);
              }
              local_ab0 = &local_f50;
              local_728 = local_ab0;
              if (local_f48 != (int *)0x0) {
                local_72c = 0xffffffff;
                LOCK();
                local_730 = *local_f48;
                *local_f48 = *local_f48 + -1;
                UNLOCK();
                if (local_730 == 1) {
                  if (local_f30 == (Allocator *)0x0) {
                    local_540 = local_f50;
                    if (local_f50 != (void *)0x0) {
                      free(local_f50);
                    }
                  }
                  else {
                    (*local_f30->_vptr_Allocator[3])(local_f30,local_f50);
                  }
                }
              }
              local_f50 = (void *)0x0;
              local_f40 = 0;
              local_f38 = 0;
              local_f28 = 0;
              local_f24 = 0;
              local_f20 = 0;
              local_f1c = 0;
              local_f18 = 0;
              local_f10 = 0;
              local_f48 = (int *)0x0;
              local_aa0 = &local_ec0;
              local_748 = local_aa0;
              if (local_eb8 != (int *)0x0) {
                local_74c = 0xffffffff;
                LOCK();
                local_750 = *local_eb8;
                *local_eb8 = *local_eb8 + -1;
                UNLOCK();
                if (local_750 == 1) {
                  if (local_ea0 == (Allocator *)0x0) {
                    local_530 = local_ec0;
                    if (local_ec0 != (void *)0x0) {
                      free(local_ec0);
                    }
                  }
                  else {
                    (*local_ea0->_vptr_Allocator[3])(local_ea0,local_ec0);
                  }
                }
              }
              local_ec0 = (void *)0x0;
              local_eb0 = 0;
              local_ea8 = 0;
              local_e98 = 0;
              local_e94 = 0;
              local_e90 = 0;
              local_e8c = 0;
              local_e88 = 0;
              local_e80 = 0;
              local_eb8 = (int *)0x0;
            }
          }
          local_b54 = 0;
        }
      }
      local_d4c = 1;
      ppvVar4 = &local_e28;
      if (local_e20 != (int *)0x0) {
        local_76c = 0xffffffff;
        LOCK();
        local_770 = *local_e20;
        *local_e20 = *local_e20 + -1;
        UNLOCK();
        if (local_770 == 1) {
          local_a90 = ppvVar4;
          local_768 = ppvVar4;
          if (local_e08 == (Allocator *)0x0) {
            local_520 = local_e28;
            if (local_e28 != (void *)0x0) {
              free(local_e28);
            }
          }
          else {
            (*local_e08->_vptr_Allocator[3])(local_e08,local_e28);
          }
        }
      }
      *ppvVar4 = (void *)0x0;
      ppvVar4[2] = (void *)0x0;
      *(undefined4 *)(ppvVar4 + 3) = 0;
      *(undefined4 *)(ppvVar4 + 5) = 0;
      *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
      *(undefined4 *)(ppvVar4 + 6) = 0;
      *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
      *(undefined4 *)(ppvVar4 + 7) = 0;
      ppvVar4[8] = (void *)0x0;
      ppvVar4[1] = (void *)0x0;
    }
  }
  else {
    local_b54 = 0;
  }
  return local_b54;
}

Assistant:

int Crop::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    Mat& top_blob = top_blobs[0];

    int _woffset, _hoffset, _doffset, _coffset = -1;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}